

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O0

Acb_Ntk_t * Acb_NtkFromAbc(Abc_Ntk_t *p)

{
  uint uVar1;
  Abc_Nam_t *p_00;
  int iVar2;
  int iVar3;
  int nCos;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  Acb_Man_t *p_01;
  Acb_Ntk_t *p_02;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  word x;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Acb_Ntk_t *pNtk;
  int local_20;
  int NameId;
  int k;
  int i;
  Acb_Man_t *pMan;
  Abc_Ntk_t *p_local;
  
  pcVar6 = Abc_NtkSpec(p);
  p_01 = Acb_ManAlloc(pcVar6,1,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,
                      (Hash_IntMan_t *)0x0);
  p_00 = p_01->pStrs;
  pcVar6 = Abc_NtkName(p);
  iVar2 = Abc_NamStrFindOrAdd(p_00,pcVar6,(int *)0x0);
  iVar3 = Abc_NtkCiNum(p);
  nCos = Abc_NtkCoNum(p);
  iVar4 = Abc_NtkObjNumMax(p);
  p_02 = Acb_NtkAlloc(p_01,iVar2,iVar3,nCos,iVar4 + -1);
  iVar2 = Abc_NtkIsSopLogic(p);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsSopLogic(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                  ,0x4f,"Acb_Ntk_t *Acb_NtkFromAbc(Abc_Ntk_t *)");
  }
  p_02->nFaninMax = 6;
  NameId = 1;
  while( true ) {
    iVar2 = Abc_NtkObjNumMax(p);
    if (iVar2 <= NameId) {
      for (NameId = 0; iVar2 = Vec_PtrSize(p->vObjs), NameId < iVar2; NameId = NameId + 1) {
        pAVar7 = Abc_NtkObj(p,NameId);
        if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar7), iVar2 != 0)) {
          for (local_20 = 0; iVar2 = Abc_ObjFaninNum(pAVar7), local_20 < iVar2;
              local_20 = local_20 + 1) {
            pAVar8 = Abc_ObjFanin(pAVar7,local_20);
            Acb_ObjAddFanin(p_02,(pAVar7->field_6).iTemp,(pAVar8->field_6).iTemp);
          }
        }
      }
      for (NameId = 0; iVar2 = Abc_NtkCoNum(p), NameId < iVar2; NameId = NameId + 1) {
        pAVar7 = Abc_NtkCo(p,NameId);
        iVar2 = (pAVar7->field_6).iTemp;
        pAVar7 = Abc_ObjFanin(pAVar7,0);
        Acb_ObjAddFanin(p_02,iVar2,(pAVar7->field_6).iTemp);
      }
      Acb_NtkCleanObjTruths(p_02);
      for (NameId = 0; iVar2 = Vec_PtrSize(p->vObjs), NameId < iVar2; NameId = NameId + 1) {
        pAVar7 = Abc_NtkObj(p,NameId);
        if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar7), iVar2 != 0)) {
          iVar2 = (pAVar7->field_6).iTemp;
          pcVar6 = (char *)(pAVar7->field_5).pData;
          iVar3 = Abc_ObjFaninNum(pAVar7);
          x = Abc_SopToTruth(pcVar6,iVar3);
          Acb_ObjSetTruth(p_02,iVar2,x);
        }
      }
      iVar2 = Abc_NtkLatchNum(p);
      Acb_NtkSetRegNum(p_02,iVar2);
      Acb_NtkAdd(p_01,p_02);
      return p_02;
    }
    pAVar7 = Abc_NtkObj(p,NameId);
    if (pAVar7 == (Abc_Obj_t *)0x0) {
      Acb_ObjAlloc(p_02,ABC_OPER_NONE,0,0);
    }
    else {
      iVar2 = Abc_ObjIsCi(pAVar7);
      if (iVar2 == 0) {
        iVar2 = Abc_ObjIsCo(pAVar7);
        if (iVar2 == 0) {
          iVar2 = Abc_ObjIsNode(pAVar7);
          if (iVar2 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                          ,0x5c,"Acb_Ntk_t *Acb_NtkFromAbc(Abc_Ntk_t *)");
          }
          iVar2 = Abc_ObjFaninNum(pAVar7);
          iVar2 = Acb_ObjAlloc(p_02,ABC_OPER_LUT,iVar2,0);
          (pAVar7->field_6).iTemp = iVar2;
        }
        else {
          iVar2 = Acb_ObjAlloc(p_02,ABC_OPER_CO,1,0);
          (pAVar7->field_6).iTemp = iVar2;
        }
      }
      else {
        iVar2 = Acb_ObjAlloc(p_02,ABC_OPER_CI,0,0);
        (pAVar7->field_6).iTemp = iVar2;
      }
    }
    if ((pAVar7 != (Abc_Obj_t *)0x0) &&
       (uVar1 = (pAVar7->field_6).iTemp, uVar5 = Abc_ObjId(pAVar7), uVar1 != uVar5)) break;
    NameId = NameId + 1;
  }
  __assert_fail("pObj == NULL || pObj->iTemp == (int)Abc_ObjId(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                ,0x5d,"Acb_Ntk_t *Acb_NtkFromAbc(Abc_Ntk_t *)");
}

Assistant:

Acb_Ntk_t * Acb_NtkFromAbc( Abc_Ntk_t * p )
{
    Acb_Man_t * pMan = Acb_ManAlloc( Abc_NtkSpec(p), 1, NULL, NULL, NULL, NULL );
    int i, k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, Abc_NtkName(p), NULL );
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Abc_NtkCiNum(p), Abc_NtkCoNum(p), Abc_NtkObjNumMax(p)-1 );
    Abc_Obj_t * pObj, * pFanin;
    assert( Abc_NtkIsSopLogic(p) );
    pNtk->nFaninMax = 6;
    for ( i = 1; i < Abc_NtkObjNumMax(p); i++ )
    {
        pObj = Abc_NtkObj( p, i );
        if ( pObj == NULL )
            Acb_ObjAlloc( pNtk, ABC_OPER_NONE, 0, 0 );
        else if ( Abc_ObjIsCi(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        else if ( Abc_ObjIsCo(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        else if ( Abc_ObjIsNode(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_LUT, Abc_ObjFaninNum(pObj), 0 );
        else assert( 0 );
        assert( pObj == NULL || pObj->iTemp == (int)Abc_ObjId(pObj) );
    }
    Abc_NtkForEachNode( p, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Acb_ObjAddFanin( pNtk, pObj->iTemp, pFanin->iTemp );
    Abc_NtkForEachCo( p, pObj, i )
        Acb_ObjAddFanin( pNtk, pObj->iTemp, Abc_ObjFanin(pObj, 0)->iTemp );
    Acb_NtkCleanObjTruths( pNtk );
    Abc_NtkForEachNode( p, pObj, i )
        Acb_ObjSetTruth( pNtk, pObj->iTemp, Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj)) );
    Acb_NtkSetRegNum( pNtk, Abc_NtkLatchNum(p) );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}